

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O2

void CVmObjDict::rebuild_cb_2(void *ctx0,CVmHashEntry *entry0)

{
  byte *pbVar1;
  undefined1 *puVar2;
  long lVar3;
  _func_int **pp_Var4;
  size_t sVar5;
  CVmHashEntry *pCVar6;
  undefined4 *puVar7;
  uint32_t tmp_1;
  size_t sVar8;
  uint16_t tmp;
  short sVar9;
  CVmHashEntry *pCVar10;
  
  sVar9 = 0;
  pCVar10 = entry0 + 1;
  for (pCVar6 = pCVar10; pCVar6->_vptr_CVmHashEntry != (_func_int **)0x0;
      pCVar6 = (CVmHashEntry *)(pCVar6->_vptr_CVmHashEntry + 1)) {
    sVar9 = sVar9 + 1;
  }
  sVar5 = entry0->len_;
  puVar2 = *(undefined1 **)((long)ctx0 + 0x10);
  *(undefined1 **)((long)ctx0 + 0x10) = puVar2 + 1;
  *puVar2 = (char)sVar5;
  memcpy(*(void **)((long)ctx0 + 0x10),entry0->str_,entry0->len_);
  lVar3 = *(long *)((long)ctx0 + 0x10);
  sVar5 = entry0->len_;
  for (sVar8 = 0; sVar5 != sVar8; sVar8 = sVar8 + 1) {
    pbVar1 = (byte *)(lVar3 + sVar8);
    *pbVar1 = *pbVar1 ^ 0xbd;
  }
  sVar5 = entry0->len_;
  lVar3 = *(long *)((long)ctx0 + 0x10);
  *(size_t *)((long)ctx0 + 0x10) = lVar3 + sVar5;
  *(short *)(lVar3 + sVar5) = sVar9;
  puVar7 = (undefined4 *)(*(long *)((long)ctx0 + 0x10) + 2);
  *(undefined4 **)((long)ctx0 + 0x10) = puVar7;
  while (pp_Var4 = pCVar10->_vptr_CVmHashEntry, pp_Var4 != (_func_int **)0x0) {
    *puVar7 = *(undefined4 *)pp_Var4;
    *(undefined2 *)(*(long *)((long)ctx0 + 0x10) + 4) = *(undefined2 *)((long)pp_Var4 + 4);
    puVar7 = (undefined4 *)(*(long *)((long)ctx0 + 0x10) + 6);
    *(undefined4 **)((long)ctx0 + 0x10) = puVar7;
    pCVar10 = (CVmHashEntry *)(pp_Var4 + 1);
  }
  return;
}

Assistant:

void CVmObjDict::rebuild_cb_2(void *ctx0, class CVmHashEntry *entry0)
{
    rebuild_ctx *ctx = (rebuild_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_dict_entry *cur;
    size_t cnt;
    char *p;
    size_t rem;

    /* count the entries in our list */
    for (cnt = 0, cur = entry->get_head() ; cur != 0 ;
         cur = cur->nxt_, ++cnt) ;

    /* write the length of the key string followed by the key string */
    *ctx->dst++ = (char)entry->getlen();
    memcpy(ctx->dst, entry->getstr(), entry->getlen());

    /* xor the key string's bytes */
    for (p = ctx->dst, rem = entry->getlen() ; rem != 0 ;
         --rem, ++p)
        *p ^= 0xBD;

    /* move past the key string */
    ctx->dst += entry->getlen();

    /* write the item count */
    oswp2(ctx->dst, cnt);
    ctx->dst += 2;

    /* write the items */
    for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* write the object ID and property ID for this item */
        oswp4(ctx->dst, (ulong)cur->obj_);
        oswp2(ctx->dst + 4, (uint)cur->prop_);
        ctx->dst += 6;
    }
}